

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::updateActivityLbChange(HighsDomain *this,HighsInt col,double oldbound,double newbound)

{
  ObjectivePropagation *this_00;
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  HighsLp *pHVar5;
  pointer pHVar6;
  _Elt_pointer pCVar7;
  _Elt_pointer pCVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  byte bVar10;
  pointer piVar11;
  long lVar12;
  int iVar13;
  _Map_pointer ppCVar14;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *pvVar15;
  long lVar16;
  CutpoolPropagation *cutpoolprop;
  long lVar17;
  _Elt_pointer this_01;
  _Elt_pointer pCVar18;
  _Map_pointer ppCVar19;
  ConflictPoolPropagation *conflictprop;
  _Elt_pointer pCVar20;
  _Elt_pointer this_02;
  double dVar21;
  double dVar22;
  HighsCDouble HVar23;
  HighsCDouble activity;
  HighsCDouble activity_00;
  ulong local_40;
  
  pHVar5 = this->mipsolver->model_;
  piVar11 = (pHVar5->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = piVar11[col];
  iVar4 = piVar11[(long)col + 1];
  this_00 = &this->objProp_;
  if (((this->objProp_).domain == (HighsDomain *)0x0) ||
     (ObjectivePropagation::updateActivityLbChange(this_00,col,oldbound,newbound),
     this->infeasible_ == false)) {
    lVar12 = (long)iVar3;
    iVar13 = iVar3;
    if (iVar3 != iVar4) {
      lVar17 = 0;
      local_40 = 0xfffffffd;
      do {
        dVar2 = (pHVar5->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar12 + lVar17];
        iVar13 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12 + lVar17];
        if (dVar2 <= 0.0) {
          HVar23 = computeDelta(dVar2,oldbound,newbound,-INFINITY,
                                (this->activitymaxinf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + iVar13);
          dVar21 = HVar23.hi;
          iVar13 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12 + lVar17];
          pHVar6 = (this->activitymax_).
                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar2 = pHVar6[iVar13].hi;
          activity_00.hi = dVar21 + dVar2;
          pHVar6[iVar13].hi = activity_00.hi;
          activity_00.lo =
               (dVar2 - (activity_00.hi - dVar21)) +
               (dVar21 - (activity_00.hi - (activity_00.hi - dVar21))) + pHVar6[iVar13].lo +
               HVar23.lo;
          pHVar6[iVar13].lo = activity_00.lo;
          if (((this->recordRedundantRows_ == true) &&
              ((pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar13] <= -INFINITY)) &&
             (dVar2 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar13], dVar2 < INFINITY)) {
            updateRedundantRows(this,iVar13,-1,
                                (this->activitymaxinf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar13],activity_00,dVar2);
          }
          if (0.0 <= dVar21 + HVar23.lo) goto LAB_00294604;
          piVar11 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          lVar16 = (long)piVar11[lVar12 + lVar17];
          dVar2 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar16];
          iVar13 = (this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
          if ((dVar2 <= -INFINITY) || (iVar13 != 0)) {
            if (1 < iVar13) goto LAB_00294678;
          }
          else {
            pHVar6 = (this->activitymax_).
                     super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar21 = pHVar6[lVar16].hi;
            dVar22 = dVar2 - dVar21;
            dVar22 = (((dVar2 - (dVar21 + dVar22)) + (-dVar21 - (dVar22 - (dVar21 + dVar22)))) -
                     pHVar6[lVar16].lo) + dVar22;
            pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
            if (*pdVar1 <= dVar22 && dVar22 != *pdVar1) {
              local_40 = 0xfffffffc;
              goto LAB_002946ac;
            }
          }
          if (-INFINITY < dVar2) goto LAB_00294663;
        }
        else {
          HVar23 = computeDelta(dVar2,oldbound,newbound,-INFINITY,
                                (this->activitymininf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + iVar13);
          dVar21 = HVar23.hi;
          iVar13 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12 + lVar17];
          pHVar6 = (this->activitymin_).
                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar2 = pHVar6[iVar13].hi;
          activity.hi = dVar21 + dVar2;
          pHVar6[iVar13].hi = activity.hi;
          activity.lo = (dVar2 - (activity.hi - dVar21)) +
                        (dVar21 - (activity.hi - (activity.hi - dVar21))) + pHVar6[iVar13].lo +
                        HVar23.lo;
          pHVar6[iVar13].lo = activity.lo;
          if (((this->recordRedundantRows_ == true) &&
              (dVar2 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar13], -INFINITY < dVar2)) &&
             (INFINITY <=
              (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar13])) {
            updateRedundantRows(this,iVar13,1,
                                (this->activitymininf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar13],activity,dVar2);
          }
          if (dVar21 + HVar23.lo <= 0.0) {
LAB_00294604:
            updateThresholdLbChange
                      (this,col,newbound,
                       (pHVar5->a_matrix_).value_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12 + lVar17],
                       (this->capacityThreshold_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start +
                       (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar12 + lVar17]);
          }
          else {
            piVar11 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar16 = (long)piVar11[lVar12 + lVar17];
            dVar2 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar16];
            iVar13 = (this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16];
            if ((INFINITY <= dVar2) || (iVar13 != 0)) {
              if (1 < iVar13) goto LAB_00294678;
            }
            else {
              pHVar6 = (this->activitymin_).
                       super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar21 = pHVar6[lVar16].hi;
              dVar22 = dVar21 - dVar2;
              dVar22 = (-dVar2 - (dVar22 - dVar21)) + (dVar21 - (dVar22 - (dVar22 - dVar21))) +
                       pHVar6[lVar16].lo + dVar22;
              pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
              if (*pdVar1 <= dVar22 && dVar22 != *pdVar1) {
LAB_002946ac:
                this->infeasible_ = true;
                this->infeasible_pos =
                     (HighsInt)
                     ((ulong)((long)(this->domchgstack_).
                                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->domchgstack_).
                                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
                this->infeasible_reason =
                     (Reason)((ulong)(uint)piVar11[lVar12 + lVar17] << 0x20 | local_40);
                iVar13 = iVar3 + (int)lVar17 + 1;
                break;
              }
            }
            if (dVar2 < INFINITY) {
LAB_00294663:
              if ((this->propagateflags_).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar16] == '\0') {
                markPropagate(this,(HighsInt)lVar16);
              }
            }
          }
        }
LAB_00294678:
        lVar17 = lVar17 + 1;
        iVar13 = iVar4;
      } while ((iVar3 - iVar4) + (int)lVar17 != 0);
    }
    bVar10 = this->infeasible_;
    if ((bool)bVar10 == false) {
      this_01 = (this->cutpoolpropagation).
                super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pCVar7 = (this->cutpoolpropagation).
               super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (this_01 != pCVar7) {
        pCVar20 = (this->cutpoolpropagation).
                  super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppCVar14 = (this->cutpoolpropagation).
                   super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          CutpoolPropagation::updateActivityLbChange(this_01,col,oldbound,newbound);
          this_01 = this_01 + 1;
          if (this_01 == pCVar20) {
            this_01 = ppCVar14[1];
            ppCVar14 = ppCVar14 + 1;
            pCVar20 = this_01 + 3;
          }
        } while (this_01 != pCVar7);
        bVar10 = this->infeasible_;
      }
    }
    if ((bVar10 & 1) == 0) {
      this_02 = (this->conflictPoolPropagation).
                super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pCVar8 = (this->conflictPoolPropagation).
               super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (this_02 != pCVar8) {
        pCVar18 = (this->conflictPoolPropagation).
                  super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppCVar19 = (this->conflictPoolPropagation).
                   super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          ConflictPoolPropagation::updateActivityLbChange(this_02,col,oldbound,newbound);
          this_02 = this_02 + 1;
          if (this_02 == pCVar18) {
            this_02 = ppCVar19[1];
            ppCVar19 = ppCVar19 + 1;
            pCVar18 = this_02 + 3;
          }
        } while (this_02 != pCVar8);
      }
    }
    else {
      iVar13 = iVar13 - iVar3;
      if (iVar13 != 0) {
        do {
          dVar2 = (pHVar5->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar12];
          pvVar15 = &this->activitymax_;
          pvVar9 = &this->activitymaxinf_;
          if (0.0 < dVar2) {
            pvVar15 = &this->activitymin_;
            pvVar9 = &this->activitymininf_;
          }
          HVar23 = computeDelta(dVar2,newbound,oldbound,-INFINITY,
                                (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start +
                                (pHVar5->a_matrix_).index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar12]);
          dVar21 = HVar23.hi;
          iVar3 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
          pHVar6 = (pvVar15->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          dVar2 = pHVar6[iVar3].hi;
          dVar22 = dVar21 + dVar2;
          pHVar6[iVar3].hi = dVar22;
          pHVar6[iVar3].lo =
               (dVar2 - (dVar22 - dVar21)) + (dVar21 - (dVar22 - (dVar22 - dVar21))) +
               pHVar6[iVar3].lo + HVar23.lo;
          lVar12 = lVar12 + 1;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      if (this_00->domain != (HighsDomain *)0x0) {
        ObjectivePropagation::updateActivityLbChange(this_00,col,newbound,oldbound);
        return;
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::updateActivityLbChange(HighsInt col, double oldbound,
                                         double newbound) {
  auto mip = mipsolver->model_;
  HighsInt start = mip->a_matrix_.start_[col];
  HighsInt end = mip->a_matrix_.start_[col + 1];

  assert(!infeasible_);

  if (objProp_.isActive()) {
    objProp_.updateActivityLbChange(col, oldbound, newbound);
    if (infeasible_) return;
  }

  for (HighsInt i = start; i != end; ++i) {
    if (mip->a_matrix_.value_[i] > 0) {
      HighsCDouble deltamin =
          computeDelta(mip->a_matrix_.value_[i], oldbound, newbound, -kHighsInf,
                       activitymininf_[mip->a_matrix_.index_[i]]);
      activitymin_[mip->a_matrix_.index_[i]] += deltamin;

#ifndef NDEBUG
      {
        HighsInt tmpinf;
        HighsCDouble tmpminact;
        computeMinActivity(
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i]],
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i] + 1],
            mipsolver->mipdata_->ARindex_.data(),
            mipsolver->mipdata_->ARvalue_.data(), tmpinf, tmpminact);
        assert(std::fabs(double(activitymin_[mip->a_matrix_.index_[i]] -
                                tmpminact)) <= mipsolver->mipdata_->feastol);
        assert(tmpinf == activitymininf_[mip->a_matrix_.index_[i]]);
      }
#endif

      if (recordRedundantRows_ &&
          mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf &&
          mip->row_upper_[mip->a_matrix_.index_[i]] == kHighsInf)
        updateRedundantRows(mip->a_matrix_.index_[i], HighsInt{1},
                            activitymininf_[mip->a_matrix_.index_[i]],
                            activitymin_[mip->a_matrix_.index_[i]],
                            mip->row_lower_[mip->a_matrix_.index_[i]]);

      if (deltamin <= 0) {
        updateThresholdLbChange(col, newbound, mip->a_matrix_.value_[i],
                                capacityThreshold_[mip->a_matrix_.index_[i]]);
        continue;
      }

      if (mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf &&
          activitymininf_[mip->a_matrix_.index_[i]] == 0 &&
          activitymin_[mip->a_matrix_.index_[i]] -
                  mip->row_upper_[mip->a_matrix_.index_[i]] >
              mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        infeasible_ = true;
        infeasible_pos = domchgstack_.size();
        infeasible_reason = Reason::modelRowUpper(mip->a_matrix_.index_[i]);
        end = i + 1;
        break;
      }

      if (activitymininf_[mip->a_matrix_.index_[i]] <= 1 &&
          !propagateflags_[mip->a_matrix_.index_[i]] &&
          mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf)
        markPropagate(mip->a_matrix_.index_[i]);
    } else {
      HighsCDouble deltamax =
          computeDelta(mip->a_matrix_.value_[i], oldbound, newbound, -kHighsInf,
                       activitymaxinf_[mip->a_matrix_.index_[i]]);
      activitymax_[mip->a_matrix_.index_[i]] += deltamax;

#ifndef NDEBUG
      {
        HighsInt tmpinf;
        HighsCDouble tmpmaxact;
        computeMaxActivity(
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i]],
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i] + 1],
            mipsolver->mipdata_->ARindex_.data(),
            mipsolver->mipdata_->ARvalue_.data(), tmpinf, tmpmaxact);
        assert(std::fabs(double(activitymax_[mip->a_matrix_.index_[i]] -
                                tmpmaxact)) <= mipsolver->mipdata_->feastol);
        assert(tmpinf == activitymaxinf_[mip->a_matrix_.index_[i]]);
      }
#endif

      if (recordRedundantRows_ &&
          mip->row_lower_[mip->a_matrix_.index_[i]] == -kHighsInf &&
          mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf)
        updateRedundantRows(mip->a_matrix_.index_[i], HighsInt{-1},
                            activitymaxinf_[mip->a_matrix_.index_[i]],
                            activitymax_[mip->a_matrix_.index_[i]],
                            mip->row_upper_[mip->a_matrix_.index_[i]]);

      if (deltamax >= 0) {
        updateThresholdLbChange(col, newbound, mip->a_matrix_.value_[i],
                                capacityThreshold_[mip->a_matrix_.index_[i]]);
        continue;
      }

      if (mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf &&
          activitymaxinf_[mip->a_matrix_.index_[i]] == 0 &&
          mip->row_lower_[mip->a_matrix_.index_[i]] -
                  activitymax_[mip->a_matrix_.index_[i]] >
              mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        infeasible_ = true;
        infeasible_pos = domchgstack_.size();
        infeasible_reason = Reason::modelRowLower(mip->a_matrix_.index_[i]);
        end = i + 1;
        break;
      }

      if (activitymaxinf_[mip->a_matrix_.index_[i]] <= 1 &&
          !propagateflags_[mip->a_matrix_.index_[i]] &&
          mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf)
        markPropagate(mip->a_matrix_.index_[i]);
    }
  }

  if (!infeasible_) {
    for (CutpoolPropagation& cutpoolprop : cutpoolpropagation)
      cutpoolprop.updateActivityLbChange(col, oldbound, newbound);
  } else {
    assert(infeasible_reason.type == Reason::kModelRowLower ||
           infeasible_reason.type == Reason::kModelRowUpper);
    assert(infeasible_reason.index == mip->a_matrix_.index_[end - 1]);
  }

  if (infeasible_) {
    std::swap(oldbound, newbound);
    for (HighsInt i = start; i != end; ++i) {
      if (mip->a_matrix_.value_[i] > 0) {
        activitymin_[mip->a_matrix_.index_[i]] +=
            computeDelta(mip->a_matrix_.value_[i], oldbound, newbound,
                         -kHighsInf, activitymininf_[mip->a_matrix_.index_[i]]);
      } else {
        activitymax_[mip->a_matrix_.index_[i]] +=
            computeDelta(mip->a_matrix_.value_[i], oldbound, newbound,
                         -kHighsInf, activitymaxinf_[mip->a_matrix_.index_[i]]);
      }
    }

    if (objProp_.isActive()) {
      objProp_.updateActivityLbChange(col, oldbound, newbound);
    }

    return;
  } else {
    for (ConflictPoolPropagation& conflictprop : conflictPoolPropagation)
      conflictprop.updateActivityLbChange(col, oldbound, newbound);
  }
}